

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O0

void __thiscall
solitaire::SolitaireEmptyHandTest_trySelectNextStockPileCard_Test::TestBody
          (SolitaireEmptyHandTest_trySelectNextStockPileCard_Test *this)

{
  element_type *peVar1;
  MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_00;
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_01;
  element_type *__return_storage_ptr__;
  MockSpec<void_()> *this_02;
  HistoryTrackerMock *this_03;
  MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  *this_04;
  StockPileMock *in_RSI;
  WithoutMatchers local_c1;
  StrictMock<solitaire::archivers::SnapshotMock> *local_c0;
  StrictMock<solitaire::archivers::SnapshotMock> *local_b8;
  Matcher<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
  local_b0;
  MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  local_98;
  WithoutMatchers local_71;
  MockSpec<void_()> local_70;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *local_60;
  Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  local_58;
  WithoutMatchers local_35 [13];
  MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  local_28;
  InSequence local_11;
  SolitaireEmptyHandTest_trySelectNextStockPileCard_Test *pSStack_10;
  InSequence seq;
  SolitaireEmptyHandTest_trySelectNextStockPileCard_Test *this_local;
  
  pSStack_10 = this;
  testing::InSequence::InSequence(&local_11);
  peVar1 = std::
           __shared_ptr_access<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&(this->super_SolitaireEmptyHandTest).super_SolitaireTest.stockPileMock);
  local_28.function_mocker_ =
       (FunctionMocker<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
        *)piles::StockPileMock::gmock_getCards
                    ((MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                      *)peVar1,in_RSI);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
            ::operator()(&local_28,local_35,(void *)0x0);
  this_01 = testing::internal::
            MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
            ::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0x151,"*stockPileMock","getCards()");
  local_60 = (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             testing::
             ReturnRef<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>const>
                       ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                        (anonymous_namespace)::oneCard);
  testing::internal::ReturnRefAction::operator_cast_to_Action
            (&local_58,(ReturnRefAction *)&local_60);
  testing::internal::
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  ::WillOnce(this_01,&local_58);
  testing::
  Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>::
  ~Action(&local_58);
  peVar1 = std::
           __shared_ptr_access<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&(this->super_SolitaireEmptyHandTest).super_SolitaireTest.stockPileMock);
  SolitaireEmptyHandTest::expectSnapshotCreation<solitaire::piles::StockPileMock>
            (&this->super_SolitaireEmptyHandTest,peVar1,
             &(this->super_SolitaireEmptyHandTest).snapshotMock);
  __return_storage_ptr__ =
       std::
       __shared_ptr_access<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
       ::operator*((__shared_ptr_access<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&(this->super_SolitaireEmptyHandTest).super_SolitaireTest.stockPileMock);
  local_70.function_mocker_ =
       (FunctionMocker<void_()> *)
       piles::StockPileMock::gmock_trySelectNextCard
                 ((MockSpec<void_()> *)__return_storage_ptr__,peVar1);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<void_()>::operator()(&local_70,&local_71,(void *)0x0);
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            (this_02,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x153,"*stockPileMock","trySelectNextCard()");
  this_03 = &mock_ptr<testing::StrictMock<solitaire::archivers::HistoryTrackerMock>_>::operator*
                       (&(this->super_SolitaireEmptyHandTest).super_SolitaireTest.historyTrackerMock
                       )->super_HistoryTrackerMock;
  local_c0 = mock_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>_>::get
                       (&(this->super_SolitaireEmptyHandTest).snapshotMock);
  local_b8 = (StrictMock<solitaire::archivers::SnapshotMock> *)
             testing::no_adl::Pointer<testing::StrictMock<solitaire::archivers::SnapshotMock>*>
                       (&local_c0);
  testing::internal::PointerMatcher::operator_cast_to_Matcher(&local_b0,(PointerMatcher *)&local_b8)
  ;
  archivers::HistoryTrackerMock::gmock_save(&local_98,this_03,&local_b0);
  testing::internal::GetWithoutMatchers();
  this_04 = testing::internal::
            MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
            ::operator()(&local_98,&local_c1,(void *)0x0);
  testing::internal::
  MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  ::InternalExpectedAt
            (this_04,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x154,"*historyTrackerMock","save(Pointer(snapshotMock.get()))");
  testing::internal::
  MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  ::~MockSpec(&local_98);
  testing::
  Matcher<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
  ::~Matcher(&local_b0);
  Solitaire::trySelectNextStockPileCard
            (&(this->super_SolitaireEmptyHandTest).super_SolitaireTest.solitaire);
  testing::InSequence::~InSequence(&local_11);
  return;
}

Assistant:

TEST_F(SolitaireEmptyHandTest, trySelectNextStockPileCard) {
    InSequence seq;
    EXPECT_CALL(*stockPileMock, getCards()).WillOnce(ReturnRef(oneCard));
    expectSnapshotCreation(*stockPileMock, snapshotMock);
    EXPECT_CALL(*stockPileMock, trySelectNextCard());
    EXPECT_CALL(*historyTrackerMock, save(Pointer(snapshotMock.get())));

    solitaire.trySelectNextStockPileCard();
}